

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_check_deviate_unique(lys_module *module,lys_deviate *deviate,lys_node *dev_target)

{
  char *value;
  int iVar1;
  ulong uVar2;
  long lVar3;
  lys_unique *plVar4;
  ulong uVar5;
  
  iVar1 = yang_read_deviate_unique(deviate,dev_target);
  if (iVar1 == 0) {
    plVar4 = (lys_unique *)(dev_target[1].ext + (ulong)dev_target->padding[3] * 2);
    if (deviate->unique_size != '\0') {
      lVar3 = 0;
      uVar5 = 0;
      do {
        value = *(char **)((long)&deviate->unique->expr + lVar3);
        if (deviate->mod == LY_DEVIATE_DEL) {
          iVar1 = yang_fill_unique(module,(lys_node_list *)dev_target,
                                   (lys_unique *)((long)&deviate->unique->expr + lVar3),value,
                                   (unres_schema *)0x0);
          if ((iVar1 != 0) ||
             (iVar1 = yang_deviate_delete_unique
                                (module,deviate,(lys_node_list *)dev_target,(int)uVar5,value),
             iVar1 != 0)) {
LAB_0014f957:
            free(value);
            goto LAB_0014f806;
          }
        }
        else if (deviate->mod == LY_DEVIATE_ADD) {
          iVar1 = yang_fill_unique(module,(lys_node_list *)dev_target,
                                   (lys_unique *)
                                   (dev_target[1].ext + (ulong)dev_target->padding[3] * 2),value,
                                   (unres_schema *)0x0);
          if (iVar1 != 0) goto LAB_0014f957;
          dev_target->padding[3] = dev_target->padding[3] + '\x01';
        }
        free(value);
        uVar5 = uVar5 + 1;
        lVar3 = lVar3 + 0x10;
      } while (uVar5 < deviate->unique_size);
    }
    iVar1 = 0;
    if (deviate->mod != LY_DEVIATE_ADD) {
      return 0;
    }
  }
  else {
    uVar5 = 0;
    plVar4 = (lys_unique *)0x0;
LAB_0014f806:
    iVar1 = 1;
    if (deviate->mod != LY_DEVIATE_ADD) {
      return 1;
    }
    if ((int)uVar5 + 1U < (uint)deviate->unique_size) {
      uVar2 = (uVar5 & 0xffffffff) + 1;
      lVar3 = (uVar5 & 0xffffffff) << 4;
      do {
        free(*(void **)((long)&deviate->unique[1].expr + lVar3));
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x10;
      } while (uVar2 < deviate->unique_size);
    }
  }
  free(deviate->unique);
  deviate->unique = plVar4;
  return iVar1;
}

Assistant:

int yang_check_deviate_unique(struct lys_module *module, struct lys_deviate *deviate, struct lys_node *dev_target)
{
    struct lys_node_list *list;
    char *str;
    uint i = 0;
    struct lys_unique *last_unique = NULL;

    if (yang_read_deviate_unique(deviate, dev_target)) {
        goto error;
    }
    list = (struct lys_node_list *)dev_target;
    last_unique = &list->unique[list->unique_size];
    for (i = 0; i < deviate->unique_size; ++i) {
        str = (char *) deviate->unique[i].expr;
        if (deviate->mod == LY_DEVIATE_ADD) {
            if (yang_fill_unique(module, list, &list->unique[list->unique_size], str, NULL)) {
                free(str);
                goto error;
            }
            list->unique_size++;
        } else if (deviate->mod == LY_DEVIATE_DEL) {
            if (yang_fill_unique(module, list, &deviate->unique[i], str, NULL)) {
                free(str);
                goto error;
            }
            if (yang_deviate_delete_unique(module, deviate, list, i, str)) {
                free(str);
                goto error;
            }
        }
        free(str);
    }
    if (deviate->mod == LY_DEVIATE_ADD) {
        free(deviate->unique);
        deviate->unique = last_unique;
    }


    return EXIT_SUCCESS;
error:
    if (deviate->mod == LY_DEVIATE_ADD) {
        for (i = i + 1; i < deviate->unique_size; ++i) {
            free(deviate->unique[i].expr);
        }
        free(deviate->unique);
        deviate->unique = last_unique;

    }
    return EXIT_FAILURE;
}